

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  int iVar1;
  long in_FS_OFFSET;
  allocator local_89;
  undefined1 local_88 [16];
  ScopedElement e;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LazyStat<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo);
  std::__cxx11::string::string((string *)&local_48,"OverallResult",(allocator *)&local_68);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"success",(allocator *)&local_68);
  XmlWriter::writeAttribute(e.m_writer,&local_48,(testCaseStats->totals).assertions.failed == 0);
  std::__cxx11::string::~string((string *)&local_48);
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    std::__cxx11::string::string((string *)&local_48,"durationInSeconds",(allocator *)local_88);
    local_68._M_dataplus._M_p = (pointer)Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::writeAttribute<double>(e.m_writer,&local_48,(double *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_48,"StdOut",&local_89);
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00,(XmlFormatting)&local_48);
    trim(&local_68,&testCaseStats->stdOut);
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,&local_68,Newline);
    std::__cxx11::string::~string((string *)&local_68);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_48,"StdErr",&local_89);
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00,(XmlFormatting)&local_48);
    trim(&local_68,&testCaseStats->stdErr);
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,&local_68,Newline);
    std::__cxx11::string::~string((string *)&local_68);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }